

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Type_indexed(int count,int *array_of_blocklengths,int *array_of_displacements,
                       MPIABI_Datatype oldtype,MPIABI_Datatype *newtype)

{
  int iVar1;
  
  iVar1 = MPI_Type_indexed();
  return iVar1;
}

Assistant:

int MPIABI_Type_indexed(
  int count,
  const int * array_of_blocklengths,
  const int * array_of_displacements,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_indexed(
    count,
    array_of_blocklengths,
    array_of_displacements,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}